

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Node **ppNVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Bool BVar4;
  Node *pNVar5;
  Node *pNVar6;
  uint code;
  Node *pNVar7;
  Node **ppNVar8;
  char *property;
  Node *pNVar9;
  
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar2 = doc->lexer;
  pLVar2->insert = (IStack *)0x0;
  pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar5 != (Node *)0x0) {
    ppNVar1 = &list->content;
    do {
      if ((pNVar5->tag == list->tag) && (pNVar5->type == EndTag)) {
        prvTidyFreeNode(doc,pNVar5);
        list->closed = yes;
        return;
      }
      BVar4 = InsertMisc(list,pNVar5);
      if (BVar4 == no) {
        pDVar3 = pNVar5->tag;
        if (pNVar5->type == TextNode) {
          if (pDVar3 == (Dict *)0x0) {
LAB_0012a580:
            prvTidyUngetToken(doc);
            BVar4 = prvTidynodeHasCM(pNVar5,8);
            if ((BVar4 != no) && (pLVar2->excludeBlocks != no)) {
              code = 0xcf;
              goto LAB_0012a775;
            }
            if (pLVar2->exiled != no) {
              BVar4 = prvTidynodeHasCM(pNVar5,0x380);
              if (BVar4 != no) {
                return;
              }
              if ((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TidyTag_TABLE)) {
                return;
              }
            }
            if (((list->tag != (Dict *)0x0) && (list->tag->id == TidyTag_OL)) &&
               (pNVar6 = *ppNVar1, pNVar6 != (Node *)0x0)) {
              pNVar9 = (Node *)0x0;
              pNVar7 = (Node *)0x0;
              do {
                if (((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_LI)) &&
                   (pNVar6->type == StartTag)) {
                  pNVar7 = pNVar6;
                  pNVar9 = pNVar6;
                }
                pNVar6 = pNVar6->next;
              } while (pNVar6 != (Node *)0x0);
              if (pNVar7 != (Node *)0x0) {
                pNVar5 = prvTidyInferredTag(doc,TidyTag_LI);
                prvTidyReportError(doc,list,pNVar5,0xd4);
                prvTidyFreeNode(doc,pNVar5);
                pNVar5 = pNVar9;
                goto LAB_0012a6bc;
              }
            }
            BVar4 = prvTidynodeHasCM(pNVar5,8);
            pNVar5 = prvTidyInferredTag(doc,TidyTag_LI);
            property = "list-style: none; display: inline";
            if (BVar4 == no) {
              property = "list-style: none";
            }
            prvTidyAddStyleProperty(doc,pNVar5,property);
            prvTidyReportError(doc,list,pNVar5,0xd4);
            pNVar5->parent = list;
            pNVar6 = list->last;
            pNVar5->prev = pNVar6;
            ppNVar8 = &pNVar6->next;
            if (pNVar6 == (Node *)0x0) {
              ppNVar8 = ppNVar1;
            }
            *ppNVar8 = pNVar5;
            list->last = pNVar5;
          }
          else {
LAB_0012a556:
            if (pDVar3->id != TidyTag_LI) goto LAB_0012a580;
            pNVar5->parent = list;
            pNVar6 = list->last;
            ppNVar8 = &pNVar6->next;
            if (pNVar6 == (Node *)0x0) {
              ppNVar8 = ppNVar1;
            }
            pNVar5->prev = pNVar6;
            *ppNVar8 = pNVar5;
            list->last = pNVar5;
          }
LAB_0012a6bc:
          ParseTag(doc,pNVar5,IgnoreWhitespace);
        }
        else {
          if (pDVar3 == (Dict *)0x0) goto LAB_0012a533;
          if (pNVar5->type != EndTag) goto LAB_0012a556;
          if (pDVar3->id == TidyTag_FORM) {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
LAB_0012a533:
            prvTidyReportError(doc,list,pNVar5,0xd0);
          }
          else {
            BVar4 = prvTidynodeHasCM(pNVar5,0x10);
            pNVar6 = list;
            if (BVar4 == no) {
              while ((pNVar6 = pNVar6->parent, pNVar6 != (Node *)0x0 &&
                     ((pDVar3 = pNVar6->tag, pDVar3 == (Dict *)0x0 || (pDVar3->id != TidyTag_BODY)))
                     )) {
                if (pNVar5->tag == pDVar3) {
                  prvTidyReportError(doc,list,pNVar5,0xcf);
                  prvTidyUngetToken(doc);
                  return;
                }
              }
              goto LAB_0012a533;
            }
            prvTidyReportError(doc,list,pNVar5,0xd0);
            prvTidyPopInline(doc,pNVar5);
          }
          prvTidyFreeNode(doc,pNVar5);
        }
      }
      pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar5 != (Node *)0x0);
  }
  pNVar5 = (Node *)0x0;
  code = 0xce;
LAB_0012a775:
  prvTidyReportError(doc,list,pNVar5,code);
  return;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    return;
                }
            }

            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) )
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
                return;

            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }
        else
            /* node is <LI> */
            TY_(InsertNodeAtEnd)(list,node);

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_FOR);
}